

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::
createMultipleUniqueResourcesTest<vkt::api::(anonymous_namespace)::Framebuffer>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  Environment *this;
  RefData<vk::Handle<(vk::HandleType)23>_> data;
  RefData<vk::Handle<(vk::HandleType)23>_> data_00;
  RefData<vk::Handle<(vk::HandleType)23>_> data_01;
  RefData<vk::Handle<(vk::HandleType)23>_> data_02;
  allocator<char> local_629;
  string local_628;
  Move<vk::Handle<(vk::HandleType)23>_> local_608;
  RefData<vk::Handle<(vk::HandleType)23>_> local_5e8;
  undefined1 local_5c8 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> obj3;
  RefData<vk::Handle<(vk::HandleType)23>_> local_588;
  undefined1 local_568 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> obj2;
  RefData<vk::Handle<(vk::HandleType)23>_> local_528;
  undefined1 local_508 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> obj1;
  RefData<vk::Handle<(vk::HandleType)23>_> local_4c8;
  undefined1 local_4a8 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> obj0;
  Resources res3;
  Resources res2;
  undefined1 local_268 [8];
  Resources res1;
  Resources res0;
  Environment env;
  Context *context_local;
  TestStatus *local_10;
  
  this = (Environment *)
         &res0.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
          m_allocator;
  local_10 = __return_storage_ptr__;
  Environment::Environment(this,context,1);
  Framebuffer::Resources::Resources
            ((Resources *)
             &res1.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
              m_allocator,this,(Parameters *)((long)&context_local + 7));
  Framebuffer::Resources::Resources
            ((Resources *)local_268,this,(Parameters *)((long)&context_local + 7));
  Framebuffer::Resources::Resources
            ((Resources *)
             &res3.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
              m_allocator,
             (Environment *)
             &res0.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
              m_allocator,(Parameters *)((long)&context_local + 7));
  Framebuffer::Resources::Resources
            ((Resources *)
             &obj0.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator,
             (Environment *)
             &res0.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
              m_allocator,(Parameters *)((long)&context_local + 7));
  Framebuffer::create((Move<vk::Handle<(vk::HandleType)23>_> *)
                      &obj1.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                       m_allocator,
                      (Environment *)
                      &res0.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.
                       deleter.m_allocator,
                      (Resources *)
                      &res1.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.
                       deleter.m_allocator,(Parameters *)((long)&context_local + 7));
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_4c8,
             (Move *)&obj1.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator
            );
  data.deleter.m_deviceIface = local_4c8.deleter.m_deviceIface;
  data.object.m_internal = local_4c8.object.m_internal;
  data.deleter.m_device = local_4c8.deleter.m_device;
  data.deleter.m_allocator = local_4c8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_4a8,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)23>_> *)
             &obj1.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator);
  Framebuffer::create((Move<vk::Handle<(vk::HandleType)23>_> *)
                      &obj2.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                       m_allocator,
                      (Environment *)
                      &res0.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.
                       deleter.m_allocator,(Resources *)local_268,
                      (Parameters *)((long)&context_local + 7));
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_528,
             (Move *)&obj2.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator
            );
  data_00.deleter.m_deviceIface = local_528.deleter.m_deviceIface;
  data_00.object.m_internal = local_528.object.m_internal;
  data_00.deleter.m_device = local_528.deleter.m_device;
  data_00.deleter.m_allocator = local_528.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_508,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)23>_> *)
             &obj2.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator);
  Framebuffer::create((Move<vk::Handle<(vk::HandleType)23>_> *)
                      &obj3.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                       m_allocator,
                      (Environment *)
                      &res0.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.
                       deleter.m_allocator,
                      (Resources *)
                      &res3.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.
                       deleter.m_allocator,(Parameters *)((long)&context_local + 7));
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_588,
             (Move *)&obj3.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator
            );
  data_01.deleter.m_deviceIface = local_588.deleter.m_deviceIface;
  data_01.object.m_internal = local_588.object.m_internal;
  data_01.deleter.m_device = local_588.deleter.m_device;
  data_01.deleter.m_allocator = local_588.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_568,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)23>_> *)
             &obj3.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator);
  Framebuffer::create(&local_608,
                      (Environment *)
                      &res0.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.
                       deleter.m_allocator,
                      (Resources *)
                      &obj0.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                       m_allocator,(Parameters *)((long)&context_local + 7));
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_5e8,(Move *)&local_608);
  data_02.deleter.m_deviceIface = local_5e8.deleter.m_deviceIface;
  data_02.object.m_internal = local_5e8.object.m_internal;
  data_02.deleter.m_device = local_5e8.deleter.m_device;
  data_02.deleter.m_allocator = local_5e8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_5c8,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_608);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_5c8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_568);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_508);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_4a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_628,"Ok",&local_629);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_628);
  std::__cxx11::string::~string((string *)&local_628);
  std::allocator<char>::~allocator(&local_629);
  Framebuffer::Resources::~Resources
            ((Resources *)
             &obj0.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator);
  Framebuffer::Resources::~Resources
            ((Resources *)
             &res3.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
              m_allocator);
  Framebuffer::Resources::~Resources((Resources *)local_268);
  Framebuffer::Resources::~Resources
            ((Resources *)
             &res1.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
              m_allocator);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleUniqueResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env		(context, 1u);
	const typename Object::Resources	res0	(env, params);
	const typename Object::Resources	res1	(env, params);
	const typename Object::Resources	res2	(env, params);
	const typename Object::Resources	res3	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res0, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res1, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res2, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res3, params));
	}

	return tcu::TestStatus::pass("Ok");
}